

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Value * __thiscall wabt::interp::Thread::Pop(Thread *this)

{
  pointer puVar1;
  pointer pVVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  Value *in_RDI;
  ulong uVar5;
  
  puVar1 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start != puVar1) &&
     (uVar5 = ((long)(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
     uVar5 < puVar1[-1] || uVar5 - puVar1[-1] == 0)) {
    (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
  }
  pVVar2 = (this->values_).
           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = *(undefined4 *)&pVVar2[-1].field_0x14;
  in_RDI->type = (ValueType)pVVar2[-1].type.enum_;
  *(undefined4 *)&in_RDI->field_0x14 = uVar4;
  uVar3 = *(undefined8 *)((long)&pVVar2[-1].field_0 + 8);
  (in_RDI->field_0).i64_ = pVVar2[-1].field_0.i64_;
  *(undefined8 *)((long)&in_RDI->field_0 + 8) = uVar3;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2 + -1;
  return in_RDI;
}

Assistant:

Value Thread::Pop() {
  if (!refs_.empty() && refs_.back() >= values_.size()) {
    refs_.pop_back();
  }
  auto value = values_.back();
  values_.pop_back();
  return value;
}